

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O3

bool bssl::marshal_CA_names
               (stack_st_CRYPTO_BUFFER *config_names,stack_st_CRYPTO_BUFFER *ctx_names,CBB *cbb)

{
  int iVar1;
  size_t sVar2;
  CRYPTO_BUFFER *buf;
  uint8_t *data;
  size_t len;
  size_t i;
  bool bVar3;
  CBB child;
  CBB name_cbb;
  CBB local_90;
  CBB local_60;
  
  if (config_names != (stack_st_CRYPTO_BUFFER *)0x0) {
    ctx_names = config_names;
  }
  iVar1 = CBB_add_u16_length_prefixed(cbb,&local_90);
  if (iVar1 == 0) {
LAB_00151882:
    bVar3 = false;
  }
  else {
    if ((OPENSSL_STACK *)ctx_names != (OPENSSL_STACK *)0x0) {
      sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)ctx_names);
      if (sVar2 != 0) {
        i = 0;
        do {
          buf = (CRYPTO_BUFFER *)OPENSSL_sk_value((OPENSSL_STACK *)ctx_names,i);
          iVar1 = CBB_add_u16_length_prefixed(&local_90,&local_60);
          if (iVar1 == 0) goto LAB_00151882;
          data = CRYPTO_BUFFER_data(buf);
          len = CRYPTO_BUFFER_len(buf);
          iVar1 = CBB_add_bytes(&local_60,data,len);
          if (iVar1 == 0) goto LAB_00151882;
          i = i + 1;
        } while (sVar2 != i);
      }
    }
    iVar1 = CBB_flush(cbb);
    bVar3 = iVar1 != 0;
  }
  return bVar3;
}

Assistant:

static bool marshal_CA_names(const STACK_OF(CRYPTO_BUFFER) *config_names,
                             const STACK_OF(CRYPTO_BUFFER) *ctx_names,
                             CBB *cbb) {
  const STACK_OF(CRYPTO_BUFFER) *names =
      config_names == nullptr ? ctx_names : config_names;
  CBB child, name_cbb;

  if (!CBB_add_u16_length_prefixed(cbb, &child)) {
    return false;
  }

  if (names == nullptr) {
    return CBB_flush(cbb);
  }

  for (const CRYPTO_BUFFER *name : names) {
    if (!CBB_add_u16_length_prefixed(&child, &name_cbb) ||
        !CBB_add_bytes(&name_cbb, CRYPTO_BUFFER_data(name),
                       CRYPTO_BUFFER_len(name))) {
      return false;
    }
  }

  return CBB_flush(cbb);
}